

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::StringSegment::operator==(StringSegment *this,UnicodeString *other)

{
  UBool UVar1;
  UnicodeString local_58;
  UnicodeString *local_18;
  UnicodeString *other_local;
  StringSegment *this_local;
  
  local_18 = other;
  other_local = (UnicodeString *)this;
  toTempUnicodeString(&local_58,this);
  UVar1 = icu_63::UnicodeString::operator==(&local_58,local_18);
  icu_63::UnicodeString::~UnicodeString(&local_58);
  return UVar1 != '\0';
}

Assistant:

bool StringSegment::operator==(const UnicodeString& other) const {
    return toTempUnicodeString() == other;
}